

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

array<std::array<int,_127UL>,_127UL> * anon_unknown.dwarf_caec7::compute_error_agreement(void)

{
  int iVar1;
  char *qual2;
  char *pcVar2;
  array<std::array<int,_127UL>,_127UL> *this;
  array<std::array<int,_127UL>,_127UL> *paVar3;
  reference pvVar4;
  array<std::array<int,_127UL>,_127UL> *in_RDI;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  array<std::array<int,_127UL>,_127UL> *this_00;
  undefined4 local_8;
  undefined4 local_4;
  
  local_4 = 0x21;
  this_00 = in_RDI;
  while( true ) {
    qual2 = (char *)(long)local_4;
    pcVar2 = (char *)std::array<std::array<int,_127UL>,_127UL>::size(this_00);
    if (pcVar2 <= qual2) break;
    local_8 = 0x21;
    while( true ) {
      this = (array<std::array<int,_127UL>,_127UL> *)(long)local_8;
      paVar3 = (array<std::array<int,_127UL>,_127UL> *)
               std::array<std::array<int,_127UL>,_127UL>::size(this_00);
      if (paVar3 <= this) break;
      iVar1 = agreement((char *)this_00,qual2);
      std::array<std::array<int,_127UL>,_127UL>::operator[]
                (this,CONCAT44(iVar1,in_stack_ffffffffffffffc8));
      pvVar4 = std::array<int,_127UL>::operator[]
                         (this->_M_elems,CONCAT44(iVar1,in_stack_ffffffffffffffc8));
      *pvVar4 = iVar1;
      local_8 = local_8 + 1;
    }
    local_4 = local_4 + 1;
  }
  return in_RDI;
}

Assistant:

std::array<std::array<int, 127>, 127> compute_error_agreement(){
    std::array<std::array<int, 127>, 127> result;
    for (int i = 33; i < result.size(); i++){
        for(int j = 33; j < result.size(); j++){
            result[i][j] = agreement(i-33,j-33);
        }
    }
    return result;
}